

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Gia_ManProfileStructuresInt(Gia_Man_t *p,int nLimit,int fVerbose)

{
  int iVar1;
  Gia_ObjType_t Entry_00;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *p_05;
  int *piVar5;
  bool bVar6;
  int local_11c;
  int local_10c;
  int Entry;
  Gia_ObjType_t Type;
  int Index;
  int Code1;
  int Code0;
  int iLit;
  int nClasses;
  int *pPerm;
  int nFanouts;
  int nFanins;
  int k;
  int i;
  Gia_Obj_t *pFanout;
  Gia_Obj_t *pObj;
  Vec_Int_t *vArray;
  Vec_Int_t *vCodeOffsets;
  Vec_Int_t *vCode;
  Vec_Int_t *vFirst;
  Vec_Int_t *vCount;
  Vec_Int_t *vRes;
  int fVerbose_local;
  int nLimit_local;
  Gia_Man_t *p_local;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                  ,0x314,"void Gia_ManProfileStructuresInt(Gia_Man_t *, int, int)");
  }
  Gia_ManStaticFanoutStart(p);
  p_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_IntAlloc(iVar1 * 5);
  iVar1 = Gia_ManObjNum(p);
  p_02 = Vec_IntAlloc(iVar1);
  nFanins = 0;
  while( true ) {
    bVar6 = false;
    if (nFanins < p->nObjs) {
      pFanout = Gia_ManObj(p,nFanins);
      bVar6 = pFanout != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Vec_IntSize(p_01);
    Vec_IntPush(p_02,iVar1);
    iVar1 = Gia_ObjIsRi(p,pFanout);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninNum(p,pFanout);
      Gia_ObjFanoutNum(p,pFanout);
      iVar2 = Gia_ManEncodeObj(p,nFanins);
      Vec_IntPush(p_01,iVar2);
      if (iVar1 == 3) {
        iVar1 = Gia_ObjFaninLit2p(p,pFanout);
        iVar2 = Abc_LitRegular(iVar1);
        iVar2 = Gia_ManEncodeFanin(p,iVar2);
        Vec_IntPush(p_01,iVar2);
        iVar1 = Abc_LitIsCompl(iVar1);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjFaninLit1p(p,pFanout);
          iVar1 = Gia_ManEncodeFanin(p,iVar1);
          Vec_IntPush(p_01,iVar1);
          iVar1 = Gia_ObjFaninLit0p(p,pFanout);
          iVar1 = Gia_ManEncodeFanin(p,iVar1);
          Vec_IntPush(p_01,iVar1);
        }
        else {
          iVar1 = Gia_ObjFaninLit0p(p,pFanout);
          iVar1 = Gia_ManEncodeFanin(p,iVar1);
          Vec_IntPush(p_01,iVar1);
          iVar1 = Gia_ObjFaninLit1p(p,pFanout);
          iVar1 = Gia_ManEncodeFanin(p,iVar1);
          Vec_IntPush(p_01,iVar1);
        }
      }
      else if (iVar1 == 2) {
        iVar1 = Gia_ObjFaninLit0p(p,pFanout);
        local_11c = Gia_ManEncodeFanin(p,iVar1);
        iVar1 = Gia_ObjFaninLit1p(p,pFanout);
        iVar1 = Gia_ManEncodeFanin(p,iVar1);
        local_10c = iVar1;
        if (local_11c < iVar1) {
          local_10c = local_11c;
        }
        Vec_IntPush(p_01,local_10c);
        if (local_11c < iVar1) {
          local_11c = iVar1;
        }
        Vec_IntPush(p_01,local_11c);
      }
      else if (iVar1 == 1) {
        iVar1 = Gia_ObjFaninLit0p(p,pFanout);
        iVar1 = Gia_ManEncodeFanin(p,iVar1);
        Vec_IntPush(p_01,iVar1);
      }
      else {
        iVar1 = Gia_ObjIsRo(p,pFanout);
        if (iVar1 != 0) {
          pGVar4 = Gia_ObjRoToRi(p,pFanout);
          iVar1 = Gia_ObjFaninLit0p(p,pGVar4);
          iVar1 = Gia_ManEncodeFanin(p,iVar1);
          Vec_IntPush(p_01,iVar1);
        }
      }
      Vec_IntClear(p_00);
      for (nFanouts = 0; iVar1 = Gia_ObjFanoutNum(p,pFanout), nFanouts < iVar1;
          nFanouts = nFanouts + 1) {
        pGVar4 = Gia_ObjFanout(p,pFanout,nFanouts);
        iVar1 = Gia_ObjWhatFanin(p,pGVar4,pFanout);
        Entry_00 = Gia_ManEncodeFanout(p,pGVar4,iVar1);
        Vec_IntPush(p_00,Entry_00);
      }
      Vec_IntSort(p_00,0);
      Vec_IntAppend(p_01,p_00);
    }
    nFanins = nFanins + 1;
  }
  iVar1 = Vec_IntSize(p_02);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 == iVar2) {
    iVar1 = Vec_IntSize(p_01);
    Vec_IntPush(p_02,iVar1);
    if (fVerbose != 0) {
      printf("Showing TFI/node/TFO structures for all nodes:\n");
      nFanins = 0;
      while( true ) {
        bVar6 = false;
        if (nFanins < p->nObjs) {
          pFanout = Gia_ManObj(p,nFanins);
          bVar6 = pFanout != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        Gia_ManProfileCollect(p,nFanins,p_01,p_02,p_00);
        Gia_ManProfilePrintOne(p,nFanins,p_00);
        nFanins = nFanins + 1;
      }
    }
    p_03 = Gia_ManProfileHash(p,p_01,p_02);
    iVar1 = Vec_IntFindMax(p_03);
    p_04 = Vec_IntStart(iVar1 + 1);
    p_05 = Vec_IntStart(iVar1 + 1);
    nFanins = 0;
    while( true ) {
      bVar6 = false;
      if (nFanins < p->nObjs) {
        pFanout = Gia_ManObj(p,nFanins);
        bVar6 = pFanout != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar2 = Vec_IntEntry(p_03,nFanins);
      iVar3 = Gia_ObjIsRi(p,pFanout);
      if (iVar3 == 0) {
        iVar3 = Vec_IntEntry(p_04,iVar2);
        if (iVar3 == 0) {
          Vec_IntWriteEntry(p_05,iVar2,nFanins);
        }
        Vec_IntAddToEntry(p_04,iVar2,-1);
      }
      nFanins = nFanins + 1;
    }
    piVar5 = Vec_IntArray(p_04);
    iVar2 = Vec_IntSize(p_04);
    piVar5 = Abc_MergeSortCost(piVar5,iVar2);
    printf("Showing TFI/node/TFO structures that appear more than %d times.\n",(ulong)(uint)nLimit);
    nFanins = 0;
    while ((nFanins < iVar1 &&
           (iVar2 = Vec_IntEntry(p_04,piVar5[nFanins]),
           nLimit == -iVar2 || SBORROW4(nLimit,-iVar2) != nLimit + iVar2 < 0))) {
      printf("%6d : ",(ulong)(uint)nFanins);
      printf("%6d : ",(ulong)(uint)piVar5[nFanins]);
      iVar2 = Vec_IntEntry(p_04,piVar5[nFanins]);
      printf("Weight =%6d  ",(ulong)(uint)-iVar2);
      printf("First obj =");
      iVar2 = Vec_IntEntry(p_05,piVar5[nFanins]);
      Gia_ManProfileCollect(p,iVar2,p_01,p_02,p_00);
      iVar2 = Vec_IntEntry(p_05,piVar5[nFanins]);
      Gia_ManProfilePrintOne(p,iVar2,p_00);
      nFanins = nFanins + 1;
    }
    if (piVar5 != (int *)0x0) {
      free(piVar5);
    }
    Vec_IntFree(p_03);
    Vec_IntFree(p_04);
    Vec_IntFree(p_05);
    Vec_IntFree(p_00);
    Vec_IntFree(p_01);
    Vec_IntFree(p_02);
    Gia_ManStaticFanoutStop(p);
    return;
  }
  __assert_fail("Vec_IntSize(vCodeOffsets) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                ,0x348,"void Gia_ManProfileStructuresInt(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_ManProfileStructuresInt( Gia_Man_t * p, int nLimit, int fVerbose )
{
    Vec_Int_t * vRes, * vCount, * vFirst;
    Vec_Int_t * vCode, * vCodeOffsets, * vArray;
    Gia_Obj_t * pObj, * pFanout;
    int i, k, nFanins, nFanouts, * pPerm, nClasses;
    assert( p->pMuxes );
    Gia_ManStaticFanoutStart( p );
    // create fanout codes
    vArray = Vec_IntAlloc( 100 );
    vCode = Vec_IntAlloc( 5 * Gia_ManObjNum(p) );
    vCodeOffsets = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        Vec_IntPush( vCodeOffsets, Vec_IntSize(vCode) );
        if ( Gia_ObjIsRi(p, pObj) )
            continue;
        nFanins = Gia_ObjFaninNum(p, pObj);
        nFanouts = Gia_ObjFanoutNum(p, pObj);
        Vec_IntPush( vCode, Gia_ManEncodeObj(p, i) );
        if ( nFanins == 3 )
        {
            int iLit = Gia_ObjFaninLit2p(p, pObj);
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Abc_LitRegular(iLit)) );
            if ( Abc_LitIsCompl(iLit) )
            {
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj)) );
            }
            else
            {
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj)) );
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
            }
        }
        else if ( nFanins == 2 )
        {
            int Code0 = Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj));
            int Code1 = Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj));
            Vec_IntPush( vCode, Code0 < Code1 ? Code0 : Code1 );
            Vec_IntPush( vCode, Code0 < Code1 ? Code1 : Code0 );
        }
        else if ( nFanins == 1 )
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
        else if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, Gia_ObjRoToRi(p, pObj))) );

        // add fanouts
        Vec_IntClear( vArray );
        Gia_ObjForEachFanoutStatic( p, pObj, pFanout, k )
        {
            int Index = Gia_ObjWhatFanin( p, pFanout, pObj );
            Gia_ObjType_t Type = Gia_ManEncodeFanout( p, pFanout, Index );
            Vec_IntPush( vArray, Type );
        }
        Vec_IntSort( vArray, 0 );
        Vec_IntAppend( vCode, vArray );
    }
    assert( Vec_IntSize(vCodeOffsets) == Gia_ManObjNum(p) );
    Vec_IntPush( vCodeOffsets, Vec_IntSize(vCode) );
    // print the results
    if ( fVerbose )
    {
        printf( "Showing TFI/node/TFO structures for all nodes:\n" );
        Gia_ManForEachObj( p, pObj, i )
        {
            Gia_ManProfileCollect( p, i, vCode, vCodeOffsets, vArray );
            Gia_ManProfilePrintOne( p, i, vArray );
        }
    }

    // collect statistics
    vRes = Gia_ManProfileHash( p, vCode, vCodeOffsets );
    //Vec_IntPrint( vRes );

    // count how many times each class appears
    nClasses = Vec_IntFindMax(vRes) + 1;
    vCount = Vec_IntStart( nClasses );
    vFirst = Vec_IntStart( nClasses );
    Gia_ManForEachObj( p, pObj, i )
    {
        int Entry = Vec_IntEntry( vRes, i );
        if ( Gia_ObjIsRi(p, pObj) )
            continue;
        if ( Vec_IntEntry(vCount, Entry) == 0 )
            Vec_IntWriteEntry( vFirst, Entry, i );
        Vec_IntAddToEntry( vCount, Entry, -1 );
    }
    // sort the counts
    pPerm = Abc_MergeSortCost( Vec_IntArray(vCount), Vec_IntSize(vCount) );
    printf( "Showing TFI/node/TFO structures that appear more than %d times.\n", nLimit );
    for ( i = 0; i < nClasses-1; i++ )
    {
        if ( nLimit > -Vec_IntEntry(vCount, pPerm[i]) )
            break;
        printf( "%6d : ", i );
        printf( "%6d : ", pPerm[i] );
        printf( "Weight =%6d  ",   -Vec_IntEntry(vCount, pPerm[i]) );
        printf( "First obj =" );
        // print the object
        Gia_ManProfileCollect( p, Vec_IntEntry(vFirst, pPerm[i]), vCode, vCodeOffsets, vArray );
        Gia_ManProfilePrintOne( p, Vec_IntEntry(vFirst, pPerm[i]), vArray );
    }

    // cleanup
    ABC_FREE( pPerm );
    Vec_IntFree( vRes );
    Vec_IntFree( vCount );
    Vec_IntFree( vFirst );

    Vec_IntFree( vArray );
    Vec_IntFree( vCode );
    Vec_IntFree( vCodeOffsets );
    Gia_ManStaticFanoutStop( p );
}